

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

void __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::Encode
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *this,uchar *pOut
          ,size_t cbOut,size_t *cbUsed)

{
  size_t size;
  size_t sVar1;
  out_of_range *this_00;
  long lVar2;
  size_t offset;
  size_t cbSize;
  size_t innerSize;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *this_local;
  
  size = DerBase::EncodedSize((DerBase *)this);
  if (size < 3) {
    *cbUsed = 0;
  }
  else {
    sVar1 = GetSizeBytes(size);
    if (cbOut < sVar1 + 1 + size) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Insufficient buffer");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    *cbUsed = 0;
    *pOut = 0xa3;
    EncodeSize(size,pOut + 1,cbOut - 1,cbUsed);
    lVar2 = *cbUsed + 1;
    Extensions::Encode(&this->innerType,pOut + lVar2,cbOut - lVar2,cbUsed);
    *cbUsed = lVar2 + *cbUsed;
  }
  return;
}

Assistant:

void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed)
	{
		// Handle the case where there is no data, and we shouldn't write out anything
		size_t innerSize = innerType.EncodedSize();

		if (innerSize <= 2)
		{
			cbUsed = 0;
			return;
		}

		size_t cbSize = GetSizeBytes(innerSize);

		if (1 + cbSize + innerSize > cbOut)
		{
			throw std::out_of_range("Insufficient buffer");
		}

        size_t offset = 1;
        cbUsed = 0;

        *pOut = type;
        EncodeSize(innerSize, pOut + offset, cbOut - offset, cbUsed);

        offset += cbUsed;
        innerType.Encode(pOut + offset, cbOut - offset, cbUsed);

        cbUsed += offset;
	}